

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfTimeCode.cpp
# Opt level: O1

void __thiscall
Imf_2_5::TimeCode::TimeCode
          (TimeCode *this,int hours,int minutes,int seconds,int frame,bool dropFrame,bool colorFrame
          ,bool fieldPhase,bool bgf0,bool bgf1,bool bgf2,int binaryGroup1,int binaryGroup2,
          int binaryGroup3,int binaryGroup4,int binaryGroup5,int binaryGroup6,int binaryGroup7,
          int binaryGroup8)

{
  undefined3 in_register_00000089;
  
  setHours(this,hours);
  setMinutes(this,minutes);
  setSeconds(this,seconds);
  setFrame(this,frame);
  this->_time = (uint)bgf2 << 0x1f |
                (uint)bgf1 << 0x1e |
                (uint)bgf0 << 0x17 |
                (uint)fieldPhase << 0xf |
                (uint)colorFrame << 7 | CONCAT31(in_register_00000089,dropFrame) << 6 |
                this->_time & 0x3f7f7f3f;
  this->_user = binaryGroup8 * 0x10000000 +
                ((binaryGroup7 & 0xfU) << 0x18 |
                (binaryGroup6 & 0xfU) << 0x14 |
                (binaryGroup5 & 0xfU) << 0x10 |
                (binaryGroup4 & 0xfU) << 0xc |
                (binaryGroup3 & 0xfU) << 8 | (binaryGroup2 & 0xfU) << 4 | binaryGroup1 & 0xfU);
  return;
}

Assistant:

TimeCode::TimeCode
    (int hours,
     int minutes,
     int seconds,
     int frame,
     bool dropFrame,
     bool colorFrame,
     bool fieldPhase,
     bool bgf0,
     bool bgf1,
     bool bgf2,
     int binaryGroup1,
     int binaryGroup2,
     int binaryGroup3,
     int binaryGroup4,
     int binaryGroup5,
     int binaryGroup6,
     int binaryGroup7,
     int binaryGroup8)
{
    setHours (hours);
    setMinutes (minutes);
    setSeconds (seconds);
    setFrame (frame);
    setDropFrame (dropFrame);
    setColorFrame (colorFrame);
    setFieldPhase (fieldPhase);
    setBgf0 (bgf0);
    setBgf1 (bgf1);
    setBgf2 (bgf2);
    setBinaryGroup (1, binaryGroup1);
    setBinaryGroup (2, binaryGroup2);
    setBinaryGroup (3, binaryGroup3);
    setBinaryGroup (4, binaryGroup4);
    setBinaryGroup (5, binaryGroup5);
    setBinaryGroup (6, binaryGroup6);
    setBinaryGroup (7, binaryGroup7);
    setBinaryGroup (8, binaryGroup8);
}